

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O2

SPxId __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterSparseDim
          (SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *tol)

{
  int i;
  int iVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  pointer pnVar3;
  pointer pnVar4;
  int *piVar5;
  type_conflict5 tVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  pointer pnVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar11;
  steeppr *psVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  ulong uVar14;
  byte bVar15;
  ulong local_2f0;
  DataKey local_2e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  steeppr local_b0 [112];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  bVar15 = 0;
  pSVar2 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar3 = (pSVar2->theCoTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar4 = (pSVar2->coWeights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_2b8.m_backend.data._M_elems[0x18] = 0;
  local_2b8.m_backend.data._M_elems[0x19] = 0;
  local_2b8.m_backend.data._M_elems._104_5_ = 0;
  local_2b8.m_backend.data._M_elems[0x14] = 0;
  local_2b8.m_backend.data._M_elems[0x15] = 0;
  local_2b8.m_backend.data._M_elems[0x16] = 0;
  local_2b8.m_backend.data._M_elems[0x17] = 0;
  local_2b8.m_backend.data._M_elems[0x10] = 0;
  local_2b8.m_backend.data._M_elems[0x11] = 0;
  local_2b8.m_backend.data._M_elems[0x12] = 0;
  local_2b8.m_backend.data._M_elems[0x13] = 0;
  local_2b8.m_backend.data._M_elems[0xc] = 0;
  local_2b8.m_backend.data._M_elems[0xd] = 0;
  local_2b8.m_backend.data._M_elems[0xe] = 0;
  local_2b8.m_backend.data._M_elems[0xf] = 0;
  local_2b8.m_backend.data._M_elems[8] = 0;
  local_2b8.m_backend.data._M_elems[9] = 0;
  local_2b8.m_backend.data._M_elems[10] = 0;
  local_2b8.m_backend.data._M_elems[0xb] = 0;
  local_2b8.m_backend.data._M_elems[4] = 0;
  local_2b8.m_backend.data._M_elems[5] = 0;
  local_2b8.m_backend.data._M_elems[6] = 0;
  local_2b8.m_backend.data._M_elems[7] = 0;
  local_2b8.m_backend.data._M_elems[0] = 0;
  local_2b8.m_backend.data._M_elems[1] = 0;
  local_2b8.m_backend.data._M_elems[2] = 0;
  local_2b8.m_backend.data._M_elems[3] = 0;
  local_2b8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  uVar14 = (ulong)(uint)(pSVar2->infeasibilities).super_IdxSet.num;
  local_2e8.info = 0;
  local_2e8.idx = 0;
  local_2f0 = 0xffffffff00000000;
LAB_00442e02:
  uVar9 = uVar14 & 0xffffffff;
  do {
    uVar14 = uVar14 - 1;
    if ((int)uVar9 < 1) {
      return (SPxId)(local_2f0 | (ulong)local_2e8 & 0xffffffff);
    }
    i = (((this->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thesolver)->infeasibilities).super_IdxSet.idx[uVar14];
    lVar8 = 0x1c;
    pnVar10 = pnVar3 + i;
    pnVar11 = &local_2b8;
    for (lVar7 = lVar8; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pnVar11->m_backend).data._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
      pnVar10 = (pointer)((long)pnVar10 + ((ulong)bVar15 * -2 + 1) * 4);
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + ((ulong)bVar15 * -2 + 1) * 4);
    }
    local_2b8.m_backend.exp = pnVar3[i].m_backend.exp;
    local_2b8.m_backend.neg = pnVar3[i].m_backend.neg;
    local_2b8.m_backend.fpclass = pnVar3[i].m_backend.fpclass;
    local_2b8.m_backend.prec_elem = pnVar3[i].m_backend.prec_elem;
    pnVar11 = tol;
    pnVar13 = &result;
    for (; lVar8 != 0; lVar8 = lVar8 + -1) {
      (pnVar13->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + ((ulong)bVar15 * -2 + 1) * 4);
      pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar13 + ((ulong)bVar15 * -2 + 1) * 4);
    }
    result.m_backend.exp = (tol->m_backend).exp;
    result.m_backend.neg = (tol->m_backend).neg;
    result.m_backend.fpclass = (tol->m_backend).fpclass;
    result.m_backend.prec_elem = (tol->m_backend).prec_elem;
    if (result.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0)
    {
      result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
    }
    tVar6 = boost::multiprecision::operator<(&local_2b8,&result);
    if (tVar6) {
      lVar8 = 0x1c;
      pnVar11 = &local_2b8;
      psVar12 = local_b0;
      for (lVar7 = lVar8; lVar7 != 0; lVar7 = lVar7 + -1) {
        *(uint *)psVar12 = (pnVar11->m_backend).data._M_elems[0];
        pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar11 + ((ulong)bVar15 * -2 + 1) * 4);
        psVar12 = psVar12 + (ulong)bVar15 * -8 + 4;
      }
      local_40 = local_2b8.m_backend.exp;
      local_3c = local_2b8.m_backend.neg;
      local_38 = local_2b8.m_backend.fpclass;
      iStack_34 = local_2b8.m_backend.prec_elem;
      pnVar10 = pnVar4 + i;
      pnVar11 = &local_130;
      for (lVar7 = lVar8; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pnVar11->m_backend).data._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
        pnVar10 = (pointer)((long)pnVar10 + ((ulong)bVar15 * -2 + 1) * 4);
        pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar11 + ((ulong)bVar15 * -2 + 1) * 4);
      }
      local_130.m_backend.exp = pnVar4[i].m_backend.exp;
      local_130.m_backend.neg = pnVar4[i].m_backend.neg;
      local_130.m_backend.fpclass = pnVar4[i].m_backend.fpclass;
      local_130.m_backend.prec_elem = pnVar4[i].m_backend.prec_elem;
      pnVar11 = tol;
      pnVar13 = &local_1b0;
      for (lVar7 = lVar8; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pnVar13->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
        pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar11 + ((ulong)bVar15 * -2 + 1) * 4);
        pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar13 + ((ulong)bVar15 * -2 + 1) * 4);
      }
      local_1b0.m_backend.exp = (tol->m_backend).exp;
      local_1b0.m_backend.neg = (tol->m_backend).neg;
      local_1b0.m_backend.fpclass = (tol->m_backend).fpclass;
      local_1b0.m_backend.prec_elem = (tol->m_backend).prec_elem;
      steeppr::
      computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&result,local_b0,&local_130,&local_1b0,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_b0);
      pnVar11 = &result;
      pnVar13 = &local_2b8;
      for (; lVar8 != 0; lVar8 = lVar8 + -1) {
        (pnVar13->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
        pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar11 + ((ulong)bVar15 * -2 + 1) * 4);
        pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar13 + ((ulong)bVar15 * -2 + 1) * 4);
      }
      local_2b8.m_backend.exp = result.m_backend.exp;
      local_2b8.m_backend.neg = result.m_backend.neg;
      local_2b8.m_backend.fpclass = result.m_backend.fpclass;
      local_2b8.m_backend.prec_elem = result.m_backend.prec_elem;
      tVar6 = boost::multiprecision::operator>(&local_2b8,best);
      if (tVar6) break;
    }
    else {
      pSVar2 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      piVar5 = (pSVar2->infeasibilities).super_IdxSet.idx;
      iVar1 = (pSVar2->infeasibilities).super_IdxSet.num;
      (pSVar2->infeasibilities).super_IdxSet.num = iVar1 + -1;
      piVar5[uVar14] = piVar5[(long)iVar1 + -1];
      (pSVar2->isInfeasible).data[i] = 0;
    }
    uVar9 = (ulong)((int)uVar9 - 1);
  } while( true );
  pnVar11 = &local_2b8;
  pnVar13 = best;
  for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pnVar13->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
    pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar11 + ((ulong)bVar15 * -2 + 1) * 4);
    pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar13 + ((ulong)bVar15 * -2 + 1) * 4);
  }
  (best->m_backend).exp = local_2b8.m_backend.exp;
  (best->m_backend).neg = local_2b8.m_backend.neg;
  (best->m_backend).fpclass = local_2b8.m_backend.fpclass;
  (best->m_backend).prec_elem = local_2b8.m_backend.prec_elem;
  local_2e8 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::coId((this->
                              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).thesolver,i);
  local_2f0 = (ulong)local_2e8 & 0xffffffff00000000;
  goto LAB_00442e02;
}

Assistant:

SPxId SPxSteepPR<R>::selectEnterSparseDim(R& best, R tol)
{
   SPxId enterId;
   const R* coTest        = this->thesolver->coTest().get_const_ptr();
   const R* coWeights_ptr = this->thesolver->coWeights.get_const_ptr();

   int idx;
   R x;

   for(int i = this->thesolver->infeasibilities.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilities.index(i);
      x = coTest[idx];

      if(x < -tol)
      {
         x = steeppr::computePrice(x, coWeights_ptr[idx], tol);

         if(x > best)
         {
            best = x;
            enterId = this->thesolver->coId(idx);
         }
      }
      else
      {
         this->thesolver->infeasibilities.remove(i);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

   return enterId;
}